

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allreduce.h
# Opt level: O0

void __thiscall node_socks::node_socks(node_socks *this)

{
  string *in_RDI;
  
  std::__cxx11::string::string(in_RDI);
  std::__cxx11::string::operator=(in_RDI,"");
  return;
}

Assistant:

node_socks() { current_master = ""; }